

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPsocket.h
# Opt level: O2

int __thiscall UDPsocket::bind(UDPsocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  sockaddr_in_t sVar3;
  int opt;
  
  sVar3 = IPv4::operator_cast_to_sockaddr_in((IPv4 *)CONCAT44(in_register_00000034,__fd));
  this->self_addr = sVar3;
  this->self_addr_len = 0x10;
  iVar1 = setsockopt(this->sock,1,2,&opt,4);
  if (iVar1 < 0) {
    uVar2 = 0xfffffffb;
  }
  else {
    iVar1 = ::bind(this->sock,(sockaddr *)&this->self_addr,this->self_addr_len);
    if (iVar1 < 0) {
      uVar2 = 0xfffffffc;
    }
    else {
      iVar1 = getsockname(this->sock,(sockaddr *)&this->self_addr,&this->self_addr_len);
      uVar2 = iVar1 >> 0x1f & 0xfffffffa;
    }
  }
  return uVar2;
}

Assistant:

int bind(const IPv4& ipaddr)
	{
		self_addr = ipaddr;
		self_addr_len = sizeof(self_addr);
		int opt = 1;
		int ret = ::setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (const char*)&opt, sizeof(opt));
		if (ret < 0) {
			return (int)Status::SetSockOptError;
		}
		ret = ::bind(sock, (sockaddr_t*)&self_addr, self_addr_len);
		if (ret < 0) {
			return (int)Status::BindError;
		}
		ret = ::getsockname(sock, (sockaddr_t*)&self_addr, &self_addr_len);
		if (ret < 0) {
			return (int)Status::GetSockNameError;
		}
		return (int)Status::OK;
	}